

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseArgumentsCommand.cxx
# Opt level: O1

bool __thiscall
cmParseArgumentsCommand::InitialPass
          (cmParseArgumentsCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer pcVar1;
  cmMakefile *pcVar2;
  bool bVar3;
  iterator iVar4;
  iterator iVar5;
  iterator iVar6;
  mapped_type *pmVar7;
  mapped_type *this_00;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this_01;
  _Rb_tree_node_base *p_Var8;
  _Base_ptr p_Var9;
  size_t sVar10;
  long *plVar11;
  long *plVar12;
  size_type *psVar13;
  char *pcVar14;
  _Alloc_hider _Var15;
  ulong uVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  int iVar18;
  key_type *pkVar19;
  pointer pbVar20;
  string *arg;
  pointer pbVar21;
  unsigned_long uVar22;
  pointer pbVar23;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar24;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  list;
  string argc;
  string prefix;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unparsed;
  unsigned_long count;
  unsigned_long argvStart;
  string dup_warning;
  ostringstream argName;
  options_map options;
  string currentArgName;
  multi_map multi;
  single_map single;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  used_keywords;
  undefined1 local_3a8 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_388;
  int local_364;
  string local_360;
  ulong local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_318;
  pointer local_300;
  long *local_2f8;
  long local_2f0;
  long local_2e8;
  long lStack_2e0;
  ulong local_2d8;
  unsigned_long local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8 [3];
  ios_base local_238 [264];
  undefined1 local_130 [32];
  _Rb_tree_node_base *local_110;
  size_t local_108;
  key_type local_100;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_e0;
  long *local_b0 [2];
  long local_a0 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Stack_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  pbVar20 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar21 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  uVar16 = (long)pbVar21 - (long)pbVar20;
  if (uVar16 < 0x61) {
    local_2a8[0]._M_dataplus._M_p = (pointer)&local_2a8[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2a8,"must be called with at least 4 arguments.","");
    cmCommand::SetError(&this->super_cmCommand,local_2a8);
    local_338.field_2._M_allocated_capacity = local_2a8[0].field_2._M_allocated_capacity;
    _Var15._M_p = local_2a8[0]._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8[0]._M_dataplus._M_p == &local_2a8[0].field_2) goto LAB_003340d0;
  }
  else {
    local_2d0 = 0;
    local_364 = std::__cxx11::string::compare((char *)pbVar20);
    if (local_364 == 0) {
      if ((long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start == 0xc0) {
        bVar3 = cmSystemTools::StringToULong(pbVar20[1]._M_dataplus._M_p,&local_2d0);
        if (bVar3) {
          pbVar20 = pbVar20 + 2;
          goto LAB_0033309b;
        }
        pcVar2 = (this->super_cmCommand).Makefile;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_130,"PARSE_ARGV index \'",pbVar20 + 1);
        plVar11 = (long *)std::__cxx11::string::append((char *)local_130);
        psVar13 = (size_type *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar13) {
          local_2a8[0].field_2._0_8_ = *psVar13;
          local_2a8[0].field_2._8_8_ = plVar11[3];
          local_2a8[0]._M_dataplus._M_p = (pointer)&local_2a8[0].field_2;
        }
        else {
          local_2a8[0].field_2._0_8_ = *psVar13;
          local_2a8[0]._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_2a8[0]._M_string_length = plVar11[1];
        *plVar11 = (long)psVar13;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,local_2a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8[0]._M_dataplus._M_p != &local_2a8[0].field_2) {
          operator_delete(local_2a8[0]._M_dataplus._M_p,
                          (ulong)(local_2a8[0].field_2._M_allocated_capacity + 1));
        }
        if ((undefined1 *)local_130._0_8_ != local_130 + 0x10) goto LAB_003340be;
      }
      else {
        pcVar2 = (this->super_cmCommand).Makefile;
        local_2a8[0]._M_dataplus._M_p = (pointer)&local_2a8[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2a8,"PARSE_ARGV must be called with exactly 6 arguments.","");
        cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,local_2a8);
        local_130._16_8_ = local_2a8[0].field_2._M_allocated_capacity;
        local_130._0_8_ = local_2a8[0]._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8[0]._M_dataplus._M_p != &local_2a8[0].field_2) {
LAB_003340be:
          operator_delete((void *)local_130._0_8_,
                          (ulong)((long)&((_Base_ptr)local_130._16_8_)->_M_color + 1));
        }
      }
      cmSystemTools::s_FatalErrorOccured = true;
      goto LAB_003340d0;
    }
LAB_0033309b:
    local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
    pcVar1 = (pbVar20->_M_dataplus)._M_p;
    local_300 = pbVar21;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_338,pcVar1,pcVar1 + pbVar20->_M_string_length);
    std::__cxx11::string::append((char *)&local_338);
    local_130._24_8_ = local_130 + 8;
    local_130._8_4_ = _S_red;
    local_130._16_8_ = (_Base_ptr)0x0;
    local_108 = 0;
    _Stack_90._M_impl.super__Rb_tree_header._M_header._M_left =
         &_Stack_90._M_impl.super__Rb_tree_header._M_header;
    _Stack_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    _Stack_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    _Stack_90._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_e0._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_e0._M_impl.super__Rb_tree_header._M_header;
    local_e0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_e0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_e0._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_318.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_318.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_318.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
    local_110 = (_Rb_tree_node_base *)local_130._24_8_;
    local_e0._M_impl.super__Rb_tree_header._M_header._M_right =
         local_e0._M_impl.super__Rb_tree_header._M_header._M_left;
    _Stack_90._M_impl.super__Rb_tree_header._M_header._M_right =
         _Stack_90._M_impl.super__Rb_tree_header._M_header._M_left;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2c8,"keyword defined more than once: ","");
    local_388.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (key_type *)0x0;
    local_388.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (key_type *)0x0;
    local_388.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_340 = uVar16;
    cmSystemTools::ExpandListArgument(pbVar20 + 1,&local_388,false);
    pbVar21 = local_388.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (local_388.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_388.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar23 = local_388.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        pVar24 = std::
                 _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                 ::_M_insert_unique<std::__cxx11::string_const&>
                           ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                             *)&local_60,pbVar23);
        if (((undefined1  [16])pVar24 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          pcVar2 = (this->super_cmCommand).Makefile;
          std::operator+(local_2a8,&local_2c8,pbVar23);
          cmMakefile::IssueMessage(pcVar2,WARNING,local_2a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8[0]._M_dataplus._M_p != &local_2a8[0].field_2) {
            operator_delete(local_2a8[0]._M_dataplus._M_p,
                            (ulong)(local_2a8[0].field_2._M_allocated_capacity + 1));
          }
        }
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                      *)local_130,pbVar23);
        pbVar23 = pbVar23 + 1;
      } while (pbVar23 != pbVar21);
    }
    pbVar23 = local_388.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pbVar21 = local_388.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (local_388.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_388.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      paVar17 = &(local_388.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->field_2;
      do {
        plVar11 = (long *)(((key_type *)(paVar17 + -1))->_M_dataplus)._M_p;
        if (paVar17 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar11) {
          operator_delete(plVar11,paVar17->_M_allocated_capacity + 1);
        }
        pkVar19 = (key_type *)(paVar17 + 1);
        paVar17 = paVar17 + 2;
      } while (pkVar19 != pbVar23);
      local_388.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbVar21;
    }
    cmSystemTools::ExpandListArgument(pbVar20 + 2,&local_388,false);
    pbVar21 = local_388.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (local_388.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_388.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar23 = local_388.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        pVar24 = std::
                 _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                 ::_M_insert_unique<std::__cxx11::string_const&>
                           ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                             *)&local_60,pbVar23);
        if (((undefined1  [16])pVar24 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          pcVar2 = (this->super_cmCommand).Makefile;
          std::operator+(local_2a8,&local_2c8,pbVar23);
          cmMakefile::IssueMessage(pcVar2,WARNING,local_2a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8[0]._M_dataplus._M_p != &local_2a8[0].field_2) {
            operator_delete(local_2a8[0]._M_dataplus._M_p,
                            (ulong)(local_2a8[0].field_2._M_allocated_capacity + 1));
          }
        }
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&_Stack_90,pbVar23);
        pbVar23 = pbVar23 + 1;
      } while (pbVar23 != pbVar21);
    }
    pbVar23 = local_388.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pbVar21 = local_388.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (local_388.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_388.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      paVar17 = &(local_388.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->field_2;
      do {
        plVar11 = (long *)(((key_type *)(paVar17 + -1))->_M_dataplus)._M_p;
        if (paVar17 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar11) {
          operator_delete(plVar11,paVar17->_M_allocated_capacity + 1);
        }
        pkVar19 = (key_type *)(paVar17 + 1);
        paVar17 = paVar17 + 2;
      } while (pkVar19 != pbVar23);
      local_388.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbVar21;
    }
    cmSystemTools::ExpandListArgument(pbVar20 + 3,&local_388,false);
    pbVar21 = local_388.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (local_388.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_388.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar23 = local_388.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        pVar24 = std::
                 _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                 ::_M_insert_unique<std::__cxx11::string_const&>
                           ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                             *)&local_60,pbVar23);
        if (((undefined1  [16])pVar24 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          pcVar2 = (this->super_cmCommand).Makefile;
          std::operator+(local_2a8,&local_2c8,pbVar23);
          cmMakefile::IssueMessage(pcVar2,WARNING,local_2a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8[0]._M_dataplus._M_p != &local_2a8[0].field_2) {
            operator_delete(local_2a8[0]._M_dataplus._M_p,
                            (ulong)(local_2a8[0].field_2._M_allocated_capacity + 1));
          }
        }
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                      *)&local_e0,pbVar23);
        pbVar23 = pbVar23 + 1;
      } while (pbVar23 != pbVar21);
    }
    pbVar23 = local_388.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pbVar21 = local_388.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    local_100._M_string_length = 0;
    local_100.field_2._M_local_buf[0] = '\0';
    if (local_388.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_388.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      paVar17 = &(local_388.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->field_2;
      do {
        plVar11 = (long *)(((key_type *)(paVar17 + -1))->_M_dataplus)._M_p;
        if (paVar17 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar11) {
          operator_delete(plVar11,paVar17->_M_allocated_capacity + 1);
        }
        pkVar19 = (key_type *)(paVar17 + 1);
        paVar17 = paVar17 + 2;
      } while (pkVar19 != pbVar23);
      local_388.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbVar21;
    }
    pbVar21 = local_300;
    if (local_364 == 0) {
      pcVar2 = (this->super_cmCommand).Makefile;
      paVar17 = &local_2a8[0].field_2;
      local_2a8[0]._M_dataplus._M_p = (pointer)paVar17;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"ARGC","");
      pcVar14 = cmMakefile::GetSafeDefinition(pcVar2,local_2a8);
      std::__cxx11::string::string((string *)&local_360,pcVar14,(allocator *)local_3a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8[0]._M_dataplus._M_p != paVar17) {
        operator_delete(local_2a8[0]._M_dataplus._M_p,
                        (ulong)(local_2a8[0].field_2._M_allocated_capacity + 1));
      }
      bVar3 = cmSystemTools::StringToULong(local_360._M_dataplus._M_p,&local_2d8);
      if (bVar3) {
        if (local_2d0 < local_2d8) {
          uVar22 = local_2d0;
          do {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a8,"ARGV",4);
            std::ostream::_M_insert<unsigned_long>((ulong)local_2a8);
            pcVar2 = (this->super_cmCommand).Makefile;
            std::__cxx11::stringbuf::str();
            pcVar14 = cmMakefile::GetDefinition(pcVar2,(string *)local_3a8);
            if ((_Base_ptr)local_3a8._0_8_ != (_Base_ptr)(local_3a8 + 0x10)) {
              operator_delete((void *)local_3a8._0_8_,local_3a8._16_8_ + 1);
            }
            if (pcVar14 == (char *)0x0) {
              pcVar2 = (this->super_cmCommand).Makefile;
              std::__cxx11::stringbuf::str();
              plVar11 = (long *)std::__cxx11::string::replace
                                          ((ulong)local_b0,0,(char *)0x0,0x576639);
              local_2f8 = &local_2e8;
              plVar12 = plVar11 + 2;
              if ((long *)*plVar11 == plVar12) {
                local_2e8 = *plVar12;
                lStack_2e0 = plVar11[3];
              }
              else {
                local_2e8 = *plVar12;
                local_2f8 = (long *)*plVar11;
              }
              local_2f0 = plVar11[1];
              *plVar11 = (long)plVar12;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              plVar11 = (long *)std::__cxx11::string::append((char *)&local_2f8);
              local_3a8._0_8_ = local_3a8 + 0x10;
              p_Var9 = (_Base_ptr)(plVar11 + 2);
              if ((_Base_ptr)*plVar11 == p_Var9) {
                local_3a8._16_8_ = *(undefined8 *)p_Var9;
                local_3a8._24_8_ = plVar11[3];
              }
              else {
                local_3a8._16_8_ = *(undefined8 *)p_Var9;
                local_3a8._0_8_ = (_Base_ptr)*plVar11;
              }
              local_3a8._8_8_ = plVar11[1];
              *plVar11 = (long)p_Var9;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)local_3a8);
              if ((_Base_ptr)local_3a8._0_8_ != (_Base_ptr)(local_3a8 + 0x10)) {
                operator_delete((void *)local_3a8._0_8_,local_3a8._16_8_ + 1);
              }
              if (local_2f8 != &local_2e8) {
                operator_delete(local_2f8,local_2e8 + 1);
              }
              if (local_b0[0] != local_a0) {
                operator_delete(local_b0[0],local_a0[0] + 1);
              }
              cmSystemTools::s_FatalErrorOccured = true;
            }
            else {
              local_3a8._0_8_ = local_3a8 + 0x10;
              sVar10 = strlen(pcVar14);
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_3a8,pcVar14,pcVar14 + sVar10);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &local_388,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_3a8);
              if ((_Base_ptr)local_3a8._0_8_ != (_Base_ptr)(local_3a8 + 0x10)) {
                operator_delete((void *)local_3a8._0_8_,local_3a8._16_8_ + 1);
              }
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2a8);
            std::ios_base::~ios_base(local_238);
            if (pcVar14 == (char *)0x0) {
              uVar16 = local_340;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_360._M_dataplus._M_p != &local_360.field_2) {
                operator_delete(local_360._M_dataplus._M_p,
                                (ulong)(local_360.field_2._M_allocated_capacity + 1));
                uVar16 = local_340;
              }
              goto LAB_00333dcc;
            }
            uVar22 = uVar22 + 1;
          } while (uVar22 < local_2d8);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_360._M_dataplus._M_p != &local_360.field_2) {
          operator_delete(local_360._M_dataplus._M_p,
                          (ulong)(local_360.field_2._M_allocated_capacity + 1));
        }
        goto LAB_0033349b;
      }
      pcVar2 = (this->super_cmCommand).Makefile;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3a8,
                     "PARSE_ARGV called with ARGC=\'",&local_360);
      uVar16 = local_340;
      plVar11 = (long *)std::__cxx11::string::append(local_3a8);
      psVar13 = (size_type *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar13) {
        local_2a8[0].field_2._0_8_ = *psVar13;
        local_2a8[0].field_2._8_8_ = plVar11[3];
        local_2a8[0]._M_dataplus._M_p = (pointer)paVar17;
      }
      else {
        local_2a8[0].field_2._0_8_ = *psVar13;
        local_2a8[0]._M_dataplus._M_p = (pointer)*plVar11;
      }
      local_2a8[0]._M_string_length = plVar11[1];
      *plVar11 = (long)psVar13;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,local_2a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8[0]._M_dataplus._M_p != paVar17) {
        operator_delete(local_2a8[0]._M_dataplus._M_p,
                        (ulong)(local_2a8[0].field_2._M_allocated_capacity + 1));
      }
      if ((_Base_ptr)local_3a8._0_8_ != (_Base_ptr)(local_3a8 + 0x10)) {
        operator_delete((void *)local_3a8._0_8_,local_3a8._16_8_ + 1);
      }
      cmSystemTools::s_FatalErrorOccured = true;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_360._M_dataplus._M_p != &local_360.field_2) goto LAB_00333dc4;
    }
    else {
      arg = pbVar20 + 4;
      if (arg != local_300) {
        do {
          cmSystemTools::ExpandListArgument(arg,&local_388,false);
          arg = arg + 1;
        } while (arg != pbVar21);
      }
LAB_0033349b:
      pbVar20 = local_388.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (local_388.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_388.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        iVar18 = 0;
        pbVar21 = local_388.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          iVar4 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                  ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                          *)local_130,pbVar21);
          if (iVar4._M_node == (_Base_ptr)(local_130 + 8)) {
            iVar5 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::find(&_Stack_90,pbVar21);
            if ((_Rb_tree_header *)iVar5._M_node == &_Stack_90._M_impl.super__Rb_tree_header) {
              iVar6 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                      ::find(&local_e0,pbVar21);
              if ((_Rb_tree_header *)iVar6._M_node == &local_e0._M_impl.super__Rb_tree_header) {
                if (iVar18 == 2) {
                  if (local_364 == 0) {
                    this_01 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                              std::
                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                            *)&local_e0,&local_100);
                    escape_arg(local_2a8,pbVar21);
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<std::__cxx11::string>(this_01,local_2a8);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2a8[0]._M_dataplus._M_p != &local_2a8[0].field_2) {
                      operator_delete(local_2a8[0]._M_dataplus._M_p,
                                      (ulong)(local_2a8[0].field_2._M_allocated_capacity + 1));
                    }
                    iVar18 = 2;
                  }
                  else {
                    this_00 = std::
                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                            *)&local_e0,&local_100);
                    iVar18 = 2;
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::push_back(this_00,pbVar21);
                  }
                }
                else if (iVar18 == 1) {
                  pmVar7 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&_Stack_90,&local_100);
                  iVar18 = 0;
                  std::__cxx11::string::_M_assign((string *)pmVar7);
                }
                else if (local_364 == 0) {
                  escape_arg(local_2a8,pbVar21);
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<std::__cxx11::string>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             &local_318,local_2a8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2a8[0]._M_dataplus._M_p != &local_2a8[0].field_2) {
                    operator_delete(local_2a8[0]._M_dataplus._M_p,
                                    (ulong)(local_2a8[0].field_2._M_allocated_capacity + 1));
                  }
                }
                else {
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back(&local_318,pbVar21);
                }
              }
              else {
                iVar18 = 2;
                std::__cxx11::string::_M_assign((string *)&local_100);
              }
            }
            else {
              iVar18 = 1;
              std::__cxx11::string::_M_assign((string *)&local_100);
            }
          }
          else {
            *(undefined1 *)&iVar4._M_node[2]._M_color = _S_black;
            iVar18 = 0;
          }
          pbVar21 = pbVar21 + 1;
        } while (pbVar21 != pbVar20);
      }
      if ((_Rb_tree_node_base *)local_130._24_8_ != (_Rb_tree_node_base *)(local_130 + 8)) {
        p_Var8 = (_Rb_tree_node_base *)local_130._24_8_;
        do {
          pcVar2 = (this->super_cmCommand).Makefile;
          std::operator+(local_2a8,&local_338,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var8 + 1));
          pcVar14 = "TRUE";
          if ((char)p_Var8[2]._M_color == _S_red) {
            pcVar14 = "FALSE";
          }
          cmMakefile::AddDefinition(pcVar2,local_2a8,pcVar14);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8[0]._M_dataplus._M_p != &local_2a8[0].field_2) {
            operator_delete(local_2a8[0]._M_dataplus._M_p,
                            (ulong)(local_2a8[0].field_2._M_allocated_capacity + 1));
          }
          p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
        } while (p_Var8 != (_Rb_tree_node_base *)(local_130 + 8));
      }
      if ((_Rb_tree_header *)_Stack_90._M_impl.super__Rb_tree_header._M_header._M_left !=
          &_Stack_90._M_impl.super__Rb_tree_header) {
        p_Var9 = _Stack_90._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          if (p_Var9[2]._M_parent == (_Base_ptr)0x0) {
            pcVar2 = (this->super_cmCommand).Makefile;
            std::operator+(local_2a8,&local_338,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (p_Var9 + 1));
            cmMakefile::RemoveDefinition(pcVar2,local_2a8);
          }
          else {
            pcVar2 = (this->super_cmCommand).Makefile;
            std::operator+(local_2a8,&local_338,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (p_Var9 + 1));
            cmMakefile::AddDefinition(pcVar2,local_2a8,*(char **)(p_Var9 + 2));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8[0]._M_dataplus._M_p != &local_2a8[0].field_2) {
            operator_delete(local_2a8[0]._M_dataplus._M_p,
                            (ulong)(local_2a8[0].field_2._M_allocated_capacity + 1));
          }
          p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
        } while ((_Rb_tree_header *)p_Var9 != &_Stack_90._M_impl.super__Rb_tree_header);
      }
      if ((_Rb_tree_header *)local_e0._M_impl.super__Rb_tree_header._M_header._M_left !=
          &local_e0._M_impl.super__Rb_tree_header) {
        p_Var9 = local_e0._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          if (*(_Base_ptr *)(p_Var9 + 2) == p_Var9[2]._M_parent) {
            pcVar2 = (this->super_cmCommand).Makefile;
            std::operator+(local_2a8,&local_338,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (p_Var9 + 1));
            cmMakefile::RemoveDefinition(pcVar2,local_2a8);
          }
          else {
            pcVar2 = (this->super_cmCommand).Makefile;
            std::operator+(local_2a8,&local_338,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (p_Var9 + 1));
            local_3a8._0_8_ = *(undefined8 *)(p_Var9 + 2);
            local_3a8._8_8_ = p_Var9[2]._M_parent;
            cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                      (&local_360,
                       (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)local_3a8,";");
            cmMakefile::AddDefinition(pcVar2,local_2a8,local_360._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_360._M_dataplus._M_p != &local_360.field_2) {
              operator_delete(local_360._M_dataplus._M_p,
                              (ulong)(local_360.field_2._M_allocated_capacity + 1));
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8[0]._M_dataplus._M_p != &local_2a8[0].field_2) {
            operator_delete(local_2a8[0]._M_dataplus._M_p,
                            (ulong)(local_2a8[0].field_2._M_allocated_capacity + 1));
          }
          p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
        } while ((_Rb_tree_header *)p_Var9 != &local_e0._M_impl.super__Rb_tree_header);
      }
      pcVar2 = (this->super_cmCommand).Makefile;
      if (local_318.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_318.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_2a8[0]._M_dataplus._M_p = (pointer)&local_2a8[0].field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_2a8,local_338._M_dataplus._M_p,
                   local_338._M_dataplus._M_p + local_338._M_string_length);
        uVar16 = local_340;
        std::__cxx11::string::append((char *)local_2a8);
        cmMakefile::RemoveDefinition(pcVar2,local_2a8);
      }
      else {
        local_2a8[0]._M_dataplus._M_p = (pointer)&local_2a8[0].field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_2a8,local_338._M_dataplus._M_p,
                   local_338._M_dataplus._M_p + local_338._M_string_length);
        uVar16 = local_340;
        std::__cxx11::string::append((char *)local_2a8);
        local_3a8._0_8_ =
             local_318.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_3a8._8_8_ =
             local_318.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                  (&local_360,
                   (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)local_3a8,";");
        cmMakefile::AddDefinition(pcVar2,local_2a8,local_360._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_360._M_dataplus._M_p != &local_360.field_2) {
          operator_delete(local_360._M_dataplus._M_p,
                          (ulong)(local_360.field_2._M_allocated_capacity + 1));
        }
      }
      local_360.field_2._M_allocated_capacity = local_2a8[0].field_2._M_allocated_capacity;
      local_360._M_dataplus._M_p = local_2a8[0]._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8[0]._M_dataplus._M_p != &local_2a8[0].field_2) {
LAB_00333dc4:
        operator_delete(local_360._M_dataplus._M_p,
                        (ulong)((long)&((_Base_ptr)local_360.field_2._M_allocated_capacity)->
                                       _M_color + 1));
      }
    }
LAB_00333dcc:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,
                      CONCAT71(local_100.field_2._M_allocated_capacity._1_7_,
                               local_100.field_2._M_local_buf[0]) + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_388);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
      operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_60);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_318);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~_Rb_tree(&local_e0);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&_Stack_90);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                 *)local_130);
    _Var15._M_p = local_338._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_dataplus._M_p == &local_338.field_2) goto LAB_003340d0;
  }
  operator_delete(_Var15._M_p,
                  (ulong)((long)&((_Base_ptr)local_338.field_2._M_allocated_capacity)->_M_color + 1)
                 );
LAB_003340d0:
  return 0x60 < uVar16;
}

Assistant:

bool cmParseArgumentsCommand::InitialPass(std::vector<std::string> const& args,
                                          cmExecutionStatus&)
{
  // cmake_parse_arguments(prefix options single multi <ARGN>)
  //                         1       2      3      4
  // or
  // cmake_parse_arguments(PARSE_ARGV N prefix options single multi)
  if (args.size() < 4) {
    this->SetError("must be called with at least 4 arguments.");
    return false;
  }

  std::vector<std::string>::const_iterator argIter = args.begin(),
                                           argEnd = args.end();
  bool parseFromArgV = false;
  unsigned long argvStart = 0;
  if (*argIter == "PARSE_ARGV") {
    if (args.size() != 6) {
      this->Makefile->IssueMessage(
        cmake::FATAL_ERROR,
        "PARSE_ARGV must be called with exactly 6 arguments.");
      cmSystemTools::SetFatalErrorOccured();
      return true;
    }
    parseFromArgV = true;
    argIter++; // move past PARSE_ARGV
    if (!cmSystemTools::StringToULong(argIter->c_str(), &argvStart)) {
      this->Makefile->IssueMessage(cmake::FATAL_ERROR, "PARSE_ARGV index '" +
                                     *argIter +
                                     "' is not an unsigned integer");
      cmSystemTools::SetFatalErrorOccured();
      return true;
    }
    argIter++; // move past N
  }
  // the first argument is the prefix
  const std::string prefix = (*argIter++) + "_";

  // define the result maps holding key/value pairs for
  // options, single values and multi values
  typedef std::map<std::string, bool> options_map;
  typedef std::map<std::string, std::string> single_map;
  typedef std::map<std::string, std::vector<std::string> > multi_map;
  options_map options;
  single_map single;
  multi_map multi;

  // anything else is put into a vector of unparsed strings
  std::vector<std::string> unparsed;

  // remember already defined keywords
  std::set<std::string> used_keywords;
  const std::string dup_warning = "keyword defined more than once: ";

  // the second argument is a (cmake) list of options without argument
  std::vector<std::string> list;
  cmSystemTools::ExpandListArgument(*argIter++, list);
  for (std::vector<std::string>::const_iterator iter = list.begin(),
                                                end = list.end();
       iter != end; ++iter) {
    if (!used_keywords.insert(*iter).second) {
      this->GetMakefile()->IssueMessage(cmake::WARNING, dup_warning + *iter);
    }
    options[*iter]; // default initialize
  }

  // the third argument is a (cmake) list of single argument options
  list.clear();
  cmSystemTools::ExpandListArgument(*argIter++, list);
  for (std::vector<std::string>::const_iterator iter = list.begin(),
                                                end = list.end();
       iter != end; ++iter) {
    if (!used_keywords.insert(*iter).second) {
      this->GetMakefile()->IssueMessage(cmake::WARNING, dup_warning + *iter);
    }
    single[*iter]; // default initialize
  }

  // the fourth argument is a (cmake) list of multi argument options
  list.clear();
  cmSystemTools::ExpandListArgument(*argIter++, list);
  for (std::vector<std::string>::const_iterator iter = list.begin(),
                                                end = list.end();
       iter != end; ++iter) {
    if (!used_keywords.insert(*iter).second) {
      this->GetMakefile()->IssueMessage(cmake::WARNING, dup_warning + *iter);
    }
    multi[*iter]; // default initialize
  }

  enum insideValues
  {
    NONE,
    SINGLE,
    MULTI
  } insideValues = NONE;
  std::string currentArgName;

  list.clear();
  if (!parseFromArgV) {
    // Flatten ;-lists in the arguments into a single list as was done
    // by the original function(CMAKE_PARSE_ARGUMENTS).
    for (; argIter != argEnd; ++argIter) {
      cmSystemTools::ExpandListArgument(*argIter, list);
    }
  } else {
    // in the PARSE_ARGV move read the arguments from ARGC and ARGV#
    std::string argc = this->Makefile->GetSafeDefinition("ARGC");
    unsigned long count;
    if (!cmSystemTools::StringToULong(argc.c_str(), &count)) {
      this->Makefile->IssueMessage(cmake::FATAL_ERROR,
                                   "PARSE_ARGV called with ARGC='" + argc +
                                     "' that is not an unsigned integer");
      cmSystemTools::SetFatalErrorOccured();
      return true;
    }
    for (unsigned long i = argvStart; i < count; ++i) {
      std::ostringstream argName;
      argName << "ARGV" << i;
      const char* arg = this->Makefile->GetDefinition(argName.str());
      if (!arg) {
        this->Makefile->IssueMessage(cmake::FATAL_ERROR,
                                     "PARSE_ARGV called with " +
                                       argName.str() + " not set");
        cmSystemTools::SetFatalErrorOccured();
        return true;
      }
      list.push_back(arg);
    }
  }

  // iterate over the arguments list and fill in the values where applicable
  for (argIter = list.begin(), argEnd = list.end(); argIter != argEnd;
       ++argIter) {
    const options_map::iterator optIter = options.find(*argIter);
    if (optIter != options.end()) {
      insideValues = NONE;
      optIter->second = true;
      continue;
    }

    const single_map::iterator singleIter = single.find(*argIter);
    if (singleIter != single.end()) {
      insideValues = SINGLE;
      currentArgName = *argIter;
      continue;
    }

    const multi_map::iterator multiIter = multi.find(*argIter);
    if (multiIter != multi.end()) {
      insideValues = MULTI;
      currentArgName = *argIter;
      continue;
    }

    switch (insideValues) {
      case SINGLE:
        single[currentArgName] = *argIter;
        insideValues = NONE;
        break;
      case MULTI:
        if (parseFromArgV) {
          multi[currentArgName].push_back(escape_arg(*argIter));
        } else {
          multi[currentArgName].push_back(*argIter);
        }
        break;
      default:
        if (parseFromArgV) {
          unparsed.push_back(escape_arg(*argIter));
        } else {
          unparsed.push_back(*argIter);
        }
        break;
    }
  }

  // now iterate over the collected values and update their definition
  // within the current scope. undefine if necessary.

  for (options_map::const_iterator iter = options.begin(), end = options.end();
       iter != end; ++iter) {
    this->Makefile->AddDefinition(prefix + iter->first,
                                  iter->second ? "TRUE" : "FALSE");
  }
  for (single_map::const_iterator iter = single.begin(), end = single.end();
       iter != end; ++iter) {
    if (!iter->second.empty()) {
      this->Makefile->AddDefinition(prefix + iter->first,
                                    iter->second.c_str());
    } else {
      this->Makefile->RemoveDefinition(prefix + iter->first);
    }
  }

  for (multi_map::const_iterator iter = multi.begin(), end = multi.end();
       iter != end; ++iter) {
    if (!iter->second.empty()) {
      this->Makefile->AddDefinition(
        prefix + iter->first, cmJoin(cmMakeRange(iter->second), ";").c_str());
    } else {
      this->Makefile->RemoveDefinition(prefix + iter->first);
    }
  }

  if (!unparsed.empty()) {
    this->Makefile->AddDefinition(prefix + "UNPARSED_ARGUMENTS",
                                  cmJoin(cmMakeRange(unparsed), ";").c_str());
  } else {
    this->Makefile->RemoveDefinition(prefix + "UNPARSED_ARGUMENTS");
  }

  return true;
}